

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  int iVar1;
  LogMessage *other;
  pair<bool,_const_unsigned_char_*> pVar2;
  pair<bool,_const_unsigned_char_*> p;
  uint64_t temp;
  CodedInputStream *this_local;
  byte *local_90;
  bool local_81;
  uint8_t *local_80;
  uint8_t *next;
  byte local_61;
  LogMessage local_60;
  uchar **local_28;
  byte *local_20;
  byte local_18;
  uint8_t *local_10;
  
  iVar1 = BufferSize(this);
  if ((iVar1 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    iVar1 = ReadVarintSizeAsIntSlow(this);
    return iVar1;
  }
  local_20 = this->buffer_;
  local_28 = &p.second;
  local_61 = 0;
  if (*local_20 < 0x80) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1a1);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (buffer[0]) >= (128): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&next + 3),other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (local_20[1] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<2ul>(local_20,(uint64_t *)local_28);
  }
  else if (local_20[2] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<3ul>(local_20,(uint64_t *)local_28);
  }
  else if (local_20[3] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<4ul>(local_20,(uint64_t *)local_28);
  }
  else if (local_20[4] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<5ul>(local_20,(uint64_t *)local_28);
  }
  else if (local_20[5] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<6ul>(local_20,(uint64_t *)local_28);
  }
  else if (local_20[6] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<7ul>(local_20,(uint64_t *)local_28);
  }
  else if (local_20[7] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<8ul>(local_20,(uint64_t *)local_28);
  }
  else if (local_20[8] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<9ul>(local_20,(uint64_t *)local_28);
  }
  else {
    if (0x7f < local_20[9]) {
      local_81 = false;
      local_90 = local_20 + 0xb;
      pVar2 = std::make_pair<bool,unsigned_char_const*>(&local_81,&local_90);
      local_10 = pVar2.second;
      local_18 = pVar2.first;
      goto LAB_004fc7e0;
    }
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<10ul>(local_20,(uint64_t *)local_28);
  }
  this_local._7_1_ = 1;
  pVar2 = std::make_pair<bool,unsigned_char_const*&>((bool *)((long)&this_local + 7),&local_80);
  local_10 = pVar2.second;
  local_18 = pVar2.first;
LAB_004fc7e0:
  if (((local_18 & 1) == 0) || ((uchar *)0x7fffffff < p.second)) {
    this_local._0_4_ = -1;
  }
  else {
    this->buffer_ = local_10;
    this_local._0_4_ = (int)p.second;
  }
  return (int)this_local;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64_t>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}